

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall parser::loadActionMap(parser *this)

{
  long lVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_2a0;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined4 local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined4 local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined4 local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined4 local_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined4 local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined4 local_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined4 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined4 local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  undefined4 local_28;
  
  local_2a0.first._M_dataplus._M_p = (pointer)&local_2a0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"go","");
  local_2a0.second = GO;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"throw","");
  local_258 = 1;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"look","");
  local_230 = 2;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"examine","");
  local_208 = 2;
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"rest","");
  local_1e0 = 3;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"touch","");
  local_1b8 = 4;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"pickup","");
  local_190 = 5;
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"pick","");
  local_168 = 5;
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"drop","");
  local_140 = 6;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"use","");
  local_118 = 7;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"open","");
  local_f0 = 8;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"close","");
  local_c8 = 8;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"help","");
  local_a0 = 0xb;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
  local_78 = 10;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"quit","");
  local_50 = 0xc;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"exit","");
  local_28 = 0xc;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,actions>,std::_Select1st<std::pair<std::__cxx11::string_const,actions>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,actions>>>
  ::_M_assign_unique<std::pair<std::__cxx11::string_const,actions>const*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,actions>,std::_Select1st<std::pair<std::__cxx11::string_const,actions>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,actions>>>
              *)&this->actionMap,&local_2a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
              *)&stack0xffffffffffffffe0);
  lVar1 = 0;
  do {
    if (local_38 + lVar1 != *(undefined1 **)((long)local_48 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar1));
    }
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x280);
  return;
}

Assistant:

void parser::loadActionMap() {
    actionMap = {
            {"go", GO},
            {"throw", THROW},
            {"look", LOOK},
            {"examine", LOOK},
            {"rest", REST},
            {"touch", TOUCH},
            {"pickup", PICK},
            {"pick", PICK},
            {"drop", DROP},
            {"use", USE},
            {"open", OPEN},
            {"close", OPEN},
            {"help", HELP},
            {"", NO_ACTION},
            {"quit", EXIT},
            {"exit", EXIT}
    };
}